

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PClass::InitializeSpecials(PClass *this,void *addr)

{
  BYTE *pBVar1;
  long lVar2;
  pair<const_PType_*,_unsigned_int> *ppVar3;
  
  if (this->bRuntimeClass == true) {
    if (this->ParentClass == (PClass *)0x0) {
      __assert_fail("ParentClass != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0xc5f,"void PClass::InitializeSpecials(void *) const");
    }
    InitializeSpecials(this->ParentClass,addr);
    ppVar3 = (this->SpecialInits).Array;
    for (lVar2 = (ulong)(this->SpecialInits).Count << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
      pBVar1 = this->Defaults + ppVar3->second;
      if (this->Defaults == (BYTE *)0x0) {
        pBVar1 = (BYTE *)0x0;
      }
      (*(ppVar3->first->super_PTypeBase).super_DObject._vptr_DObject[0xd])
                (ppVar3->first,(long)addr + (ulong)ppVar3->second,pBVar1);
      ppVar3 = ppVar3 + 1;
    }
  }
  return;
}

Assistant:

void PClass::InitializeSpecials(void *addr) const
{
	// Once we reach a native class, we can stop going up the family tree,
	// since native classes handle initialization natively.
	if (!bRuntimeClass)
	{
		return;
	}
	assert(ParentClass != NULL);
	ParentClass->InitializeSpecials(addr);
	for (auto tao : SpecialInits)
	{
		tao.first->InitializeValue((BYTE*)addr + tao.second, Defaults == nullptr? nullptr : Defaults + tao.second);
	}
}